

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsum.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  long *plVar1;
  undefined1 auVar2 [16];
  bool bVar3;
  byte bVar4;
  int iVar5;
  ulong uVar6;
  void *pvVar7;
  undefined8 uVar8;
  long in_RSI;
  int in_EDI;
  double dVar9;
  NaException *ex;
  bool bEOF;
  NaReal fSum;
  NaException *ex_1;
  NaDataFile **dfSeries;
  int n;
  int i;
  double local_40;
  int local_14;
  int local_4;
  
  if (in_EDI == 1) {
    fprintf(_stderr,"Error: need arguments\n");
    fprintf(_stderr,"Usage: dsum SignalSeries1 [SignalSeries2 ...]\n");
    local_4 = 1;
  }
  else {
    iVar5 = in_EDI + -1;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = (long)iVar5;
    uVar6 = SUB168(auVar2 * ZEXT816(8),0);
    if (SUB168(auVar2 * ZEXT816(8),8) != 0) {
      uVar6 = 0xffffffffffffffff;
    }
    pvVar7 = operator_new__(uVar6);
    NaOpenLogFile("dsum.log");
    for (local_14 = 0; local_14 < iVar5; local_14 = local_14 + 1) {
      uVar8 = OpenInputDataFile(*(char **)(in_RSI + 8 + (long)local_14 * 8));
      *(undefined8 *)((long)pvVar7 + (long)local_14 * 8) = uVar8;
      if (*(long *)((long)pvVar7 + (long)local_14 * 8) != 0) {
        (**(code **)(**(long **)((long)pvVar7 + (long)local_14 * 8) + 0x28))();
      }
    }
    bVar3 = false;
    do {
      local_40 = 0.0;
      for (local_14 = 0; local_14 < iVar5; local_14 = local_14 + 1) {
        if (*(long *)((long)pvVar7 + (long)local_14 * 8) != 0) {
          plVar1 = *(long **)((long)pvVar7 + (long)local_14 * 8);
          dVar9 = (double)(**(code **)(*plVar1 + 0x18))(plVar1,0);
          local_40 = local_40 + dVar9;
          bVar4 = (**(code **)(**(long **)((long)pvVar7 + (long)local_14 * 8) + 0x20))();
          if ((bVar4 & 1) == 0) {
            bVar3 = true;
          }
        }
      }
      printf("%g\n",local_40);
    } while (!bVar3);
    for (local_14 = 0; local_14 < iVar5; local_14 = local_14 + 1) {
      plVar1 = *(long **)((long)pvVar7 + (long)local_14 * 8);
      if (plVar1 != (long *)0x0) {
        (**(code **)(*plVar1 + 8))();
      }
    }
    if (pvVar7 != (void *)0x0) {
      operator_delete(pvVar7,8);
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int main (int argc, char* argv[])
{
  if(argc == 1)
    {
      fprintf(stderr, "Error: need arguments\n");
      fprintf(stderr, "Usage: dsum SignalSeries1 [SignalSeries2 ...]\n");
      return 1;
    }

  int		i, n = argc - 1;
  NaDataFile	**dfSeries = new NaDataFile*[n];

  NaOpenLogFile("dsum.log");

  for(i = 0; i < n; ++i)
    {
      try{
	dfSeries[i] = OpenInputDataFile(argv[1+i]);
	if(NULL != dfSeries[i])
	  dfSeries[i]->GoStartRecord();
      }
      catch(NaException& ex){
	NaPrintLog("Failed to open '%s' due to %s\n",
		   argv[1+i], NaExceptionMsg(ex));
	dfSeries[i] = NULL;
      }
    }

  try{
    NaReal	fSum;
    bool	bEOF = false;
    do{
      fSum = 0.0;

      for(i = 0; i < n; ++i)
	if(NULL != dfSeries[i])
	  {
	    fSum += dfSeries[i]->GetValue();
	    if(!dfSeries[i]->GoNextRecord())
	      bEOF = true;
	  }

      printf("%g\n", fSum);

    }while(!bEOF);

    for(i = 0; i < n; ++i)
      delete dfSeries[i];

    delete dfSeries;
  }
  catch(NaException& ex){
    NaPrintLog("EXCEPTION: %s\n", NaExceptionMsg(ex));
  }

  return 0;
}